

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

shared_ptr<mir::inst::PhiInst> ir_phi(VarId *var,int n)

{
  uint32_t uVar1;
  PhiInst *__p;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  VarId *__args;
  shared_ptr<mir::inst::PhiInst> sVar3;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> vars;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_58;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_40;
  
  __args = (VarId *)CONCAT44(in_register_00000034,n);
  local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_finish = (VarId *)0x0;
  local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (VarId *)0x0;
  if (0 < in_EDX) {
    do {
      if (local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
        _M_realloc_insert<mir::inst::VarId_const&>
                  ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)&local_58,
                   (iterator)
                   local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        ((local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Displayable)._vptr_Displayable =
             (_func_int **)&PTR_display_001ee058;
        (local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
         super__Vector_impl_data._M_finish)->id = __args->id;
        local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      in_EDX = in_EDX + -1;
    } while (in_EDX != 0);
  }
  __p = (PhiInst *)operator_new(0x40);
  uVar1 = __args->id;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&local_40,&local_58);
  (__p->super_Inst).dest.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  (__p->super_Inst).dest.id = uVar1;
  (__p->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001f03d8;
  (__p->ori_var).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  (__p->ori_var).id = uVar1;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&__p->vars,&local_40);
  (var->super_Displayable)._vptr_Displayable = (_func_int **)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::PhiInst*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var->id,__p);
  _Var2._M_pi = extraout_RDX;
  if (local_40.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)var;
  return (shared_ptr<mir::inst::PhiInst>)
         sVar3.super___shared_ptr<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<mir::inst::PhiInst> ir_phi(mir::inst::VarId var, int n) {
  vector<mir::inst::VarId> vars;
  for (int i = 0; i < n; i++) {
    vars.push_back(var);
  }
  return shared_ptr<mir::inst::PhiInst>(new mir::inst::PhiInst(var, vars));
}